

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int vm_builtin_include(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  sxi32 sVar1;
  undefined1 auStack_38 [4];
  sxi32 rc;
  SyString sFile;
  jx9_value **apArg_local;
  int nArg_local;
  jx9_context *pCtx_local;
  
  sFile._8_8_ = apArg;
  if (nArg < 1) {
    jx9_result_null(pCtx);
  }
  else {
    _auStack_38 = jx9_value_to_string(*apArg,(int *)&sFile);
    if ((int)sFile.zString == 0) {
      jx9_result_null(pCtx);
    }
    else {
      sVar1 = VmExecIncludedFile(pCtx,(SyString *)auStack_38,0);
      if (sVar1 != 0) {
        jx9_context_throw_error_format(pCtx,2,"IO error while importing: \'%z\'",auStack_38);
        jx9_result_bool(pCtx,0);
      }
    }
  }
  return 0;
}

Assistant:

static int vm_builtin_include(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	SyString sFile;
	sxi32 rc;
	if( nArg < 1 ){
		/* Nothing to evaluate, return NULL */
		jx9_result_null(pCtx);
		return SXRET_OK;
	}
	/* File to include */
	sFile.zString = jx9_value_to_string(apArg[0], (int *)&sFile.nByte);
	if( sFile.nByte < 1 ){
		/* Empty string, return NULL */
		jx9_result_null(pCtx);
		return SXRET_OK;
	}
	/* Open, compile and execute the desired script */
	rc = VmExecIncludedFile(&(*pCtx), &sFile, FALSE);
	if( rc != SXRET_OK ){
		/* Emit a warning and return false */
		jx9_context_throw_error_format(pCtx, JX9_CTX_WARNING, "IO error while importing: '%z'", &sFile);
		jx9_result_bool(pCtx, 0);
	}
	return SXRET_OK;
}